

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub.c
# Opt level: O0

_Bool sub0_matches(sub0_ctx *ctx,uint8_t *body,size_t len)

{
  int iVar1;
  void *local_30;
  sub0_topic *topic;
  size_t len_local;
  uint8_t *body_local;
  sub0_ctx *ctx_local;
  
  local_30 = nni_list_first(&ctx->topics);
  while( true ) {
    if (local_30 == (void *)0x0) {
      return false;
    }
    if ((*(ulong *)((long)local_30 + 0x10) <= len) &&
       ((*(long *)((long)local_30 + 0x10) == 0 ||
        (iVar1 = memcmp(*(void **)((long)local_30 + 0x18),body,*(size_t *)((long)local_30 + 0x10)),
        iVar1 == 0)))) break;
    local_30 = nni_list_next(&ctx->topics,local_30);
  }
  return true;
}

Assistant:

static bool
sub0_matches(sub0_ctx *ctx, uint8_t *body, size_t len)
{
	sub0_topic *topic;

	// This is a naive and trivial matcher.  Replace with a real
	// patricia trie later.
	NNI_LIST_FOREACH (&ctx->topics, topic) {
		if (len < topic->len) {
			continue;
		}
		if ((topic->len == 0) ||
		    (memcmp(topic->buf, body, topic->len) == 0)) {
			return (true);
		}
	}
	return (false);
}